

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::vector(vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
         *this,size_t count,optional<std::pair<int,_int>_> *value,
        polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_> *alloc)

{
  bool bVar1;
  optional<std::pair<int,_int>_> *poVar2;
  long lVar3;
  size_t sVar4;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (optional<std::pair<int,_int>_> *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,count);
  if (count != 0) {
    lVar3 = 8;
    sVar4 = count;
    do {
      poVar2 = this->ptr;
      bVar1 = value->set;
      (poVar2->optionalValue).__data[lVar3] = bVar1;
      if (bVar1 == true) {
        *(aligned_storage_t<sizeof(std::pair<int,_int>),_alignof(std::pair<int,_int>)> *)
         ((long)poVar2 + lVar3 + -8) = value->optionalValue;
      }
      lVar3 = lVar3 + 0xc;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  this->nStored = count;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }